

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O0

int __thiscall Imf_2_5::TiledOutputFile::levelWidth(TiledOutputFile *this,int lx)

{
  int iVar1;
  stringstream _iex_replace_s;
  BaseExc *e;
  int retVal;
  LevelRoundingMode in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  int in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  
  iVar1 = levelSize(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                    in_stack_fffffffffffffe28);
  return iVar1;
}

Assistant:

int
TiledOutputFile::levelWidth (int lx) const
{
    try
    {
	int retVal = levelSize (_data->minX, _data->maxX, lx,
			        _data->tileDesc.roundingMode);
        
        return retVal;
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
	REPLACE_EXC (e, "Error calling levelWidth() on image "
                 "file \"" << fileName() << "\". " << e.what());
	throw;
    }
}